

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

void __thiscall
perfetto::internal::InProcessTracingBackend::~InProcessTracingBackend(InProcessTracingBackend *this)

{
  TracingService *pTVar1;
  
  (this->super_TracingBackend)._vptr_TracingBackend =
       (_func_int **)&PTR__InProcessTracingBackend_003c8c40;
  pTVar1 = (this->service_)._M_t.
           super___uniq_ptr_impl<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::TracingService_*,_std::default_delete<perfetto::TracingService>_>
           .super__Head_base<0UL,_perfetto::TracingService_*,_false>._M_head_impl;
  if (pTVar1 != (TracingService *)0x0) {
    (*pTVar1->_vptr_TracingService[1])();
  }
  (this->service_)._M_t.
  super___uniq_ptr_impl<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_>.
  _M_t.
  super__Tuple_impl<0UL,_perfetto::TracingService_*,_std::default_delete<perfetto::TracingService>_>
  .super__Head_base<0UL,_perfetto::TracingService_*,_false>._M_head_impl = (TracingService *)0x0;
  operator_delete(this,0x10);
  return;
}

Assistant:

class PERFETTO_EXPORT_COMPONENT InProcessTracingBackend
    : public TracingBackend {
 public:
  static TracingBackend* GetInstance();

  // TracingBackend implementation.
  std::unique_ptr<ProducerEndpoint> ConnectProducer(
      const ConnectProducerArgs&) override;
  std::unique_ptr<ConsumerEndpoint> ConnectConsumer(
      const ConnectConsumerArgs&) override;

 private:
  InProcessTracingBackend();
  TracingService* GetOrCreateService(base::TaskRunner*);

  std::unique_ptr<TracingService> service_;
}